

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O1

void __thiscall
CAddress::
SerializationOps<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,CAddress,ActionUnserialize>
          (CAddress *this,ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *obj,
          undefined8 param_3,size_t param_4)

{
  SerParams *pSVar1;
  HashVerifier<DataStream> *this_00;
  char *pcVar2;
  ServiceFlags SVar3;
  SerParams *pSVar4;
  long in_FS_OFFSET;
  bool bVar5;
  SerParams ser_params;
  uint32_t obj_1;
  SerParams local_54;
  ParamsStream<ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
  local_50;
  CustomUintFormatter<2,true> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = obj->m_params;
  if (pSVar1->fmt == Network) {
    bVar5 = (pSVar1->super_SerParams).enc == V2;
  }
  else {
    if (pSVar1->fmt != Disk) {
      __assert_fail("params.fmt == Format::Network",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/protocol.h"
                    ,0x1b2,
                    "static void CAddress::SerializationOps(Type &, Stream &, Operation) [Stream = ParamsStream<HashVerifier<DataStream> &, CAddress::SerParams>, Type = CAddress, Operation = ActionUnserialize]"
                   );
    }
    this_00 = obj->m_substream;
    DataStream::read(this_00->m_source,(int)&local_50,(void *)0x4,param_4);
    CSHA256::Write((CSHA256 *)this_00,(uchar *)&local_50,4);
    bVar5 = ((ulong)local_50.m_params & 0xfff80000) != 0;
    if ((bVar5) &&
       ((((uint)local_50.m_params & 0xfff80000) != 0x20000000 ||
        ((pSVar1->super_SerParams).enc != V2)))) {
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      local_50.m_substream =
           (ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)std::iostream_category()
      ;
      local_50.m_params = (SerParams *)CONCAT44(local_50.m_params._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar2,(error_code *)"Unsupported CAddress disk format version");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_0086b653;
    }
  }
  local_50.m_params = (SerParams *)&this->nTime;
  Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
  ::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>
            ((Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              *)&local_50,obj);
  if (bVar5) {
    SVar3 = ReadCompactSize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>(obj,false);
    this->nServices = SVar3;
    pSVar4 = &CNetAddr::V2;
  }
  else {
    CustomUintFormatter<8,false>::
    Unser<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,ServiceFlags>
              ((CustomUintFormatter<8,false> *)&local_50,obj,&this->nServices);
    pSVar4 = &CNetAddr::V1;
  }
  local_54.enc = pSVar4->enc;
  local_50.m_params = &local_54;
  local_50.m_substream = obj;
  CNetAddr::
  Unserialize<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
            ((CNetAddr *)this,&local_50);
  CustomUintFormatter<2,true>::
  Unser<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_short>
            (&local_39,&local_50,&(this->super_CService).port);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0086b653:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CAddress, obj)
    {
        bool use_v2;
        auto& params = SER_PARAMS(SerParams);
        if (params.fmt == Format::Disk) {
            // In the disk serialization format, the encoding (v1 or v2) is determined by a flag version
            // that's part of the serialization itself. ADDRV2_FORMAT in the stream version only determines
            // whether V2 is chosen/permitted at all.
            uint32_t stored_format_version = DISK_VERSION_INIT;
            if (params.enc == Encoding::V2) stored_format_version |= DISK_VERSION_ADDRV2;
            READWRITE(stored_format_version);
            stored_format_version &= ~DISK_VERSION_IGNORE_MASK; // ignore low bits
            if (stored_format_version == 0) {
                use_v2 = false;
            } else if (stored_format_version == DISK_VERSION_ADDRV2 && params.enc == Encoding::V2) {
                // Only support v2 deserialization if V2 is set.
                use_v2 = true;
            } else {
                throw std::ios_base::failure("Unsupported CAddress disk format version");
            }
        } else {
            assert(params.fmt == Format::Network);
            // In the network serialization format, the encoding (v1 or v2) is determined directly by
            // the value of enc in the stream params, as no explicitly encoded version
            // exists in the stream.
            use_v2 = params.enc == Encoding::V2;
        }

        READWRITE(Using<LossyChronoFormatter<uint32_t>>(obj.nTime));
        // nServices is serialized as CompactSize in V2; as uint64_t in V1.
        if (use_v2) {
            uint64_t services_tmp;
            SER_WRITE(obj, services_tmp = obj.nServices);
            READWRITE(Using<CompactSizeFormatter<false>>(services_tmp));
            SER_READ(obj, obj.nServices = static_cast<ServiceFlags>(services_tmp));
        } else {
            READWRITE(Using<CustomUintFormatter<8>>(obj.nServices));
        }
        // Invoke V1/V2 serializer for CService parent object.
        const auto ser_params{use_v2 ? CNetAddr::V2 : CNetAddr::V1};
        READWRITE(ser_params(AsBase<CService>(obj)));
    }